

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_early_check(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *handle;
  uv_timer_t timer_handle;
  
  puVar2 = uv_default_loop();
  uVar3 = uv_now(puVar2);
  timer_early_check_expected_time = uVar3 + 10;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff60;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,timer_early_check_cb,10,0);
    if (iVar1 != 0) goto LAB_001753e8;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001753ed;
    uv_close((uv_handle_t *)&stack0xffffffffffffff60,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001753f7;
    }
  }
  else {
    run_test_timer_early_check_cold_1();
LAB_001753e8:
    run_test_timer_early_check_cold_2();
LAB_001753ed:
    run_test_timer_early_check_cold_3();
  }
  run_test_timer_early_check_cold_4();
LAB_001753f7:
  run_test_timer_early_check_cold_5();
  uVar3 = uv_hrtime();
  if (timer_early_check_expected_time <= uVar3 / 1000000) {
    return extraout_EAX;
  }
  timer_early_check_cb_cold_1();
  pcVar4 = "ONCE_CLOSE_CB";
  puts("ONCE_CLOSE_CB");
  if (puVar2 == (uv_loop_t *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)puVar2);
    pcVar4 = (char *)puVar2;
    if (iVar1 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return 0;
    }
  }
  once_close_cb_cold_1();
  handle = "REPEAT_CLOSE_CB";
  iVar1 = puts("REPEAT_CLOSE_CB");
  if ((uv_loop_t *)pcVar4 != (uv_loop_t *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return iVar1;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(timer_early_check) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  timer_early_check_expected_time = uv_now(uv_default_loop()) + timeout_ms;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_early_check_cb, timeout_ms, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}